

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriter.cpp
# Opt level: O0

void __thiscall
MILBlob::Blob::FileWriter::ReadData
          (FileWriter *this,uint64_t offset,Span<unsigned_char,_18446744073709551615UL> destData)

{
  pointer ptVar1;
  ulong uVar2;
  runtime_error *this_00;
  uint64_t offset_local;
  FileWriter *this_local;
  Span<unsigned_char,_18446744073709551615UL> destData_local;
  
  destData_local.m_ptr = (pointer)destData.m_size.m_size;
  this_local = (FileWriter *)destData.m_ptr;
  std::istream::seekg((long)this,(_Ios_Seekdir)offset);
  ptVar1 = Util::Span<unsigned_char,_18446744073709551615UL>::Data
                     ((Span<unsigned_char,_18446744073709551615UL> *)&this_local);
  Util::Span<unsigned_char,_18446744073709551615UL>::Size
            ((Span<unsigned_char,_18446744073709551615UL> *)&this_local);
  std::istream::read((char *)this,(long)ptVar1);
  uVar2 = std::ios::good();
  if ((uVar2 & 1) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"[MIL FileWriter]: Unknown error occurred while reading data from the file.")
    ;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void FileWriter::ReadData(uint64_t offset, Util::Span<uint8_t> destData)
{
    m_fileStream.seekg(static_cast<std::streamsize>(offset), std::ios::beg);
    m_fileStream.read(reinterpret_cast<char*>(destData.Data()), static_cast<std::streamsize>(destData.Size()));
    MILVerifyIsTrue(m_fileStream.good(),
                    std::runtime_error,
                    "[MIL FileWriter]: Unknown error occurred while reading data from the file.");
}